

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

void lj_trace_ins(jit_State *J,BCIns *pc)

{
  int iVar1;
  undefined8 in_RSI;
  long in_RDI;
  long local_18;
  
  *(undefined8 *)(in_RDI + 0x68) = in_RSI;
  *(ulong *)(in_RDI + 0x70) = (ulong)*(uint *)(*(long *)(*(long *)(in_RDI + 0x60) + 0x10) + -8);
  if (*(char *)(*(long *)(in_RDI + 0x70) + 6) == '\0') {
    local_18 = (ulong)*(uint *)(*(long *)(in_RDI + 0x70) + 0x10) - 0x40;
  }
  else {
    local_18 = 0;
  }
  *(long *)(in_RDI + 0x78) = local_18;
  while( true ) {
    iVar1 = lj_vm_cpcall(*(undefined8 *)(in_RDI + 0x60),0,in_RDI,trace_state);
    if (iVar1 == 0) break;
    *(undefined4 *)(in_RDI + 0xbc) = 0x15;
  }
  return;
}

Assistant:

void lj_trace_ins(jit_State *J, const BCIns *pc)
{
  /* Note: J->L must already be set. pc is the true bytecode PC here. */
  J->pc = pc;
  J->fn = curr_func(J->L);
  J->pt = isluafunc(J->fn) ? funcproto(J->fn) : NULL;
  while (lj_vm_cpcall(J->L, NULL, (void *)J, trace_state) != 0)
    J->state = LJ_TRACE_ERR;
}